

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredlines.cc
# Opt level: O0

void __thiscall gvr::ColoredLines::resizeLineList(ColoredLines *this,int ln)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  int *piVar4;
  int in_ESI;
  long in_RDI;
  int i;
  uint *p;
  int local_1c;
  int local_c [3];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(in_ESI << 1);
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  local_c[0] = in_ESI;
  pvVar3 = operator_new__(uVar2);
  piVar4 = std::min<int>((int *)(in_RDI + 0xb0),local_c);
  local_1c = *piVar4 * 2;
  while (local_1c = local_1c + -1, -1 < local_1c) {
    *(undefined4 *)((long)pvVar3 + (long)local_1c * 4) =
         *(undefined4 *)(*(long *)(in_RDI + 0xb8) + (long)local_1c * 4);
  }
  if (*(void **)(in_RDI + 0xb8) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0xb8));
  }
  *(void **)(in_RDI + 0xb8) = pvVar3;
  *(int *)(in_RDI + 0xb0) = local_c[0];
  return;
}

Assistant:

void ColoredLines::resizeLineList(int ln)
{
  unsigned int *p=new unsigned int [(ln<<1)];

  for (int i=2*std::min(n, ln)-1; i>=0; i--)
  {
    p[i]=line[i];
  }

  delete [] line;

  line=p;
  n=ln;
}